

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O0

void __thiscall
Signal<std::shared_ptr<Reaction>_>::Emit
          (Signal<std::shared_ptr<Reaction>_> *this,shared_ptr<Reaction> *p)

{
  bool bVar1;
  reference ppVar2;
  shared_ptr<Reaction> local_68;
  undefined1 local_58 [8];
  pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_> it;
  iterator __end0;
  iterator __begin0;
  map<int,_std::function<void_(std::shared_ptr<Reaction>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_>_>_>
  *__range2;
  shared_ptr<Reaction> *p_local;
  Signal<std::shared_ptr<Reaction>_> *this_local;
  
  __end0 = std::
           map<int,_std::function<void_(std::shared_ptr<Reaction>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_>_>_>
           ::begin(&this->slots_);
  it.second._M_invoker =
       (_Invoker_type)
       std::
       map<int,_std::function<void_(std::shared_ptr<Reaction>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_>_>_>
       ::end(&this->slots_);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&it.second._M_invoker);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_>_>
             ::operator*(&__end0);
    std::pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_>::pair
              ((pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_> *)local_58,ppVar2)
    ;
    std::shared_ptr<Reaction>::shared_ptr(&local_68,p);
    std::function<void_(std::shared_ptr<Reaction>)>::operator()
              ((function<void_(std::shared_ptr<Reaction>)> *)&it,&local_68);
    std::shared_ptr<Reaction>::~shared_ptr(&local_68);
    std::pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_>::~pair
              ((pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_> *)local_58);
    std::_Rb_tree_iterator<std::pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void Emit(Args... p) {
    for (auto it : slots_) {
      it.second(p...);
    }
  }